

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compact_hash_table.hpp
# Opt level: O1

void __thiscall
poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>::set_quo_
          (compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher> *this,
          uint64_t slot_id,uint64_t quo)

{
  pointer puVar1;
  uint64_t uVar2;
  byte bVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  
  puVar1 = (this->table_).chunks_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar2 = (this->table_).width_;
  uVar4 = uVar2 * slot_id;
  uVar6 = (ulong)((uint)uVar4 & 0x3f);
  uVar5 = puVar1[uVar4 >> 6];
  if (uVar2 + uVar6 < 0x41) {
    uVar5 = uVar5 >> uVar6;
  }
  else {
    bVar3 = (byte)uVar4 & 0x3f;
    uVar5 = uVar5 >> bVar3 | puVar1[(uVar4 >> 6) + 1] << 0x40 - bVar3;
  }
  compact_vector::set(&this->table_,slot_id,
                      quo << ((ulong)(byte)this->quo_shift_ & 0x3f) |
                      uVar5 & (this->table_).mask_ & this->quo_invmask_);
  return;
}

Assistant:

void set_quo_(uint64_t slot_id, uint64_t quo) {
        assert(quo < quo_size_.size());
        table_.set(slot_id, (table_.get(slot_id) & quo_invmask_) | (quo << quo_shift_));
    }